

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall Liby::TcpServer::handleAcceptEvent(TcpServer *this)

{
  EventLoop *this_00;
  bool bVar1;
  bool bVar2;
  int fd;
  element_type *peVar3;
  element_type *peVar4;
  element_type *this_01;
  element_type *in_RCX;
  sockaddr *__addr;
  char *err;
  shared_ptr<Liby::Connection> local_98;
  BasicHandler local_88;
  int local_64;
  Poller *local_60;
  ChanPtr local_58;
  undefined1 local_48 [8];
  undefined1 local_40 [8];
  ConnPtr connPtr;
  SockPtr sock;
  TcpServer *this_local;
  
  sock.super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  if (this->listenfd_ < 0) {
    __assert_fail("listenfd_ >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp"
                  ,0x23,"void Liby::TcpServer::handleAcceptEvent()");
  }
  do {
    peVar3 = std::__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->socket_);
    Socket::accept((Socket *)&stack0xffffffffffffffe0,(int)peVar3,__addr,(socklen_t *)in_RCX);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffe0);
    if (bVar1) {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffe0);
      bVar1 = false;
      if (bVar2) {
        bVar1 = this->loop_ != (EventLoop *)0x0;
      }
      if (!bVar1) {
        __assert_fail("sock && loop_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/TcpServer.cpp"
                      ,0x2a,"void Liby::TcpServer::handleAcceptEvent()");
      }
      this_00 = this->loop_;
      peVar3 = std::__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&stack0xffffffffffffffe0);
      fd = Socket::fd(peVar3);
      local_48 = (undefined1  [8])EventLoop::robinLoop(this_00,fd);
      std::make_shared<Liby::Connection,Liby::EventLoop*,std::shared_ptr<Liby::Socket>&>
                ((EventLoop **)local_40,(shared_ptr<Liby::Socket> *)local_48);
      peVar4 = std::__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_40);
      initConnection(this,peVar4);
      peVar4 = std::__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      this_01 = std::__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_40);
      local_60 = Connection::getPoller(this_01);
      peVar3 = std::__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Liby::Socket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&stack0xffffffffffffffe0);
      local_64 = Socket::fd(peVar3);
      std::make_shared<Liby::Channel,Liby::Poller*,int>((Poller **)&local_58,(int *)&local_60);
      Connection::setChannel(peVar4,&local_58);
      std::shared_ptr<Liby::Channel>::~shared_ptr(&local_58);
      peVar4 = std::__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Liby::Connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      in_RCX = peVar4;
      err = (char *)this;
      std::shared_ptr<Liby::Connection>::shared_ptr
                (&local_98,(shared_ptr<Liby::Connection> *)local_40);
      std::function<void()>::function<Liby::TcpServer::handleAcceptEvent()::__0,void>
                ((function<void()> *)&local_88,(anon_class_24_2_06df4ecf *)&err);
      Connection::runEventHandler(peVar4,&local_88);
      std::function<void_()>::~function(&local_88);
      handleAcceptEvent()::$_0::~__0((__0 *)&err);
      std::shared_ptr<Liby::Connection>::~shared_ptr((shared_ptr<Liby::Connection> *)local_40);
      connPtr.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = 0;
    }
    else {
      connPtr.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = 1;
    }
    std::shared_ptr<Liby::Socket>::~shared_ptr((shared_ptr<Liby::Socket> *)&stack0xffffffffffffffe0)
    ;
    if ((int)connPtr.super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi != 0) {
      return;
    }
  } while( true );
}

Assistant:

void TcpServer::handleAcceptEvent() {
    assert(listenfd_ >= 0);
    for (;;) {
        try {
            auto sock = socket_->accept();
            if (!sock) {
                return;
            }
            assert(sock && loop_);
            ConnPtr connPtr = std::make_shared<Connection>(
                loop_->robinLoop(sock->fd()), sock);
            initConnection(*connPtr);
            connPtr->setChannel(
                std::make_shared<Channel>(connPtr->getPoller(), sock->fd()));
            connPtr->runEventHandler([this, connPtr] {
                connPtr->init();
                connPtr->init1();
                connPtr->enableRead();
                if (acceptorCallback_) {
                    acceptorCallback_(*connPtr);
                }
            });
        } catch (const char *err) {
            debug("accept: %s", err);
            handleErroEvent();
        }
    }
}